

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O2

uint32_t get_C(istream *is)

{
  istream *piVar1;
  uint32_t uVar2;
  uint uVar3;
  char ch;
  char local_52;
  allocator<char> local_51;
  string local_50;
  
  uVar2 = 0;
  do {
    uVar3 = 0;
    while( true ) {
      if (2 < uVar3) {
        return uVar2;
      }
      piVar1 = std::operator>>(is,&local_52);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
        return uVar2;
      }
      if (local_52 != 'C') break;
      uVar2 = uVar2 + 100;
      uVar3 = uVar3 + 1;
    }
    if (local_52 != 'D') {
      if (local_52 != 'M') {
        std::istream::unget();
        return uVar2;
      }
      if (uVar3 == 1) {
        return uVar2 + 800;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Invalid roman numeral.",&local_51);
      error(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (uVar3 != 0) {
      return uVar2 + 300;
    }
    uVar2 = uVar2 + 500;
  } while( true );
}

Assistant:

uint32_t get_C(std::istream& is)
{
	uint32_t num{ 0 };
	char ch;
	uint32_t repeats{ 0 };
	while (repeats < Roman_int::max_repeating_numerals && is >> ch)
	{
		switch (ch)
		{
		case 'M':
		{
			if (repeats == 1)
			{
				return num + 800;
			}
			else
			{
				error("Invalid roman numeral.");
			}
		}
		case 'D':
		{
			if (repeats > 0)
			{
				return num + 300;
			}
			else
			{
				num += 500;
			}
			break;
		}
		case 'C':
		{
			num += 100;
			++repeats;
			break;
		}
		default:
			is.unget();
			return num;
		}
	}
	return num;
}